

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector4 Vector4Max(Vector4 v1,Vector4 v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector4 VVar10;
  
  fVar1 = v1.x;
  fVar2 = v1.y;
  fVar3 = v2.x;
  fVar5 = v2.y;
  fVar9 = fVar3;
  if (fVar3 <= fVar1) {
    fVar9 = fVar1;
  }
  VVar10.x = ~-(uint)NAN(fVar1) & (uint)fVar9 | -(uint)NAN(fVar1) & (uint)fVar3;
  fVar9 = fVar5;
  if (fVar5 <= fVar2) {
    fVar9 = fVar2;
  }
  fVar3 = v1.z;
  fVar4 = v1.w;
  fVar6 = v2.z;
  fVar8 = v2.w;
  fVar1 = fVar6;
  if (fVar6 <= fVar3) {
    fVar1 = fVar3;
  }
  fVar7 = fVar8;
  if (fVar8 <= fVar4) {
    fVar7 = fVar4;
  }
  VVar10.y = (float)(~-(uint)NAN(fVar2) & (uint)fVar9 | -(uint)NAN(fVar2) & (uint)fVar5);
  VVar10.w = (float)(~-(uint)NAN(fVar4) & (uint)fVar7 | -(uint)NAN(fVar4) & (uint)fVar8);
  VVar10.z = (float)(~-(uint)NAN(fVar3) & (uint)fVar1 | -(uint)NAN(fVar3) & (uint)fVar6);
  return VVar10;
}

Assistant:

RMAPI Vector4 Vector4Max(Vector4 v1, Vector4 v2)
{
    Vector4 result = { 0 };

    result.x = fmaxf(v1.x, v2.x);
    result.y = fmaxf(v1.y, v2.y);
    result.z = fmaxf(v1.z, v2.z);
    result.w = fmaxf(v1.w, v2.w);

    return result;
}